

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O1

Gia_Man_t * Gia_ManDupToBarBufs(Gia_Man_t *p,int nBarBufs)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  int *piVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  
  if (p->nBufs != 0) {
    __assert_fail("Gia_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x138,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x139,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  if (p->pSibls == (int *)0x0) {
    __assert_fail("Gia_ManHasChoices(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x13a,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  iVar1 = p->vCis->nSize;
  iVar2 = p->vCos->nSize;
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pName = pcVar9;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  uVar5 = iVar1 - nBarBufs;
  p_00->pSpec = pcVar9;
  if (p->pSibls != (int *)0x0) {
    piVar10 = (int *)calloc((long)p->nObjs,4);
    p_00->pSibls = piVar10;
  }
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  if (0 < (int)uVar5) {
    uVar16 = 0;
    do {
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar14 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar14 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar14 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_007ac72b;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_007ac72b;
      if ((long)p->vCis->nSize <= (long)uVar16) goto LAB_007ac70c;
      iVar13 = p->vCis->pArray[uVar16];
      if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_007ac6ed;
      p->pObjs[iVar13].Value = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
      uVar16 = uVar16 + 1;
    } while (uVar5 != uVar16);
  }
  if (p->nObjs < 1) {
    uVar15 = 0;
  }
  else {
    lVar12 = 0;
    uVar15 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + lVar12;
      if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
        uVar7 = uVar15;
        if ((int)uVar15 < nBarBufs) {
          uVar16 = (ulong)uVar15;
          do {
            if ((int)uVar15 < 0) goto LAB_007ac70c;
            uVar7 = (uint)uVar16;
            if (p->vCos->nSize <= (int)uVar7) goto LAB_007ac70c;
            iVar13 = p->vCos->pArray[uVar16];
            if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_007ac6ed;
            pGVar11 = p->pObjs + iVar13;
            uVar14 = (ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff);
            if (pGVar11[-uVar14].Value == 0xffffffff) break;
            if ((int)pGVar11[-uVar14].Value < 0) goto LAB_007ac74a;
            uVar6 = Gia_ManAppendBuf(p_00,pGVar11[-uVar14].Value ^
                                          (uint)*(undefined8 *)pGVar11 >> 0x1d & 1);
            if ((int)(uVar5 + uVar15) < 0) goto LAB_007ac70c;
            if (p->vCis->nSize <= (int)(uVar5 + uVar7)) goto LAB_007ac70c;
            iVar13 = p->vCis->pArray[uVar5 + uVar7];
            if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_007ac6ed;
            p->pObjs[iVar13].Value = uVar6;
            uVar16 = uVar16 + 1;
            uVar7 = nBarBufs;
          } while ((int)uVar16 < nBarBufs);
        }
        uVar16 = *(ulong *)pGVar4;
        if ((int)pGVar4[-(ulong)((uint)uVar16 & 0x1fffffff)].Value < 0) goto LAB_007ac74a;
        uVar15 = (uint)(uVar16 >> 0x20);
        if ((int)pGVar4[-(ulong)(uVar15 & 0x1fffffff)].Value < 0) goto LAB_007ac74a;
        uVar6 = Gia_ManAppendAnd(p_00,(uint)(uVar16 >> 0x1d) & 1 ^
                                      pGVar4[-(ulong)((uint)uVar16 & 0x1fffffff)].Value,
                                 pGVar4[-(ulong)(uVar15 & 0x1fffffff)].Value ^ uVar15 >> 0x1d & 1);
        pGVar4->Value = uVar6;
        pGVar11 = p->pObjs;
        if ((pGVar4 < pGVar11) || (pGVar11 + p->nObjs <= pGVar4)) {
LAB_007ac72b:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        piVar10 = p->pSibls;
        uVar15 = uVar7;
        if ((piVar10 != (int *)0x0) &&
           (iVar13 = (int)((long)pGVar4 - (long)pGVar11 >> 2) * -0x55555555, piVar10[iVar13] != 0))
        {
          iVar13 = piVar10[iVar13];
          if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_007ac6ed;
          if (((int)pGVar11[iVar13].Value < 0) || ((int)uVar6 < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          p_00->pSibls[uVar6 >> 1] = pGVar11[iVar13].Value >> 1;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < p->nObjs);
  }
  if ((int)uVar15 < nBarBufs) {
    uVar16 = (ulong)uVar15;
    uVar14 = (ulong)((iVar1 + uVar15) - nBarBufs);
    do {
      if (((int)uVar15 < 0) || (p->vCos->nSize <= (int)uVar16)) goto LAB_007ac70c;
      iVar1 = p->vCos->pArray[uVar16];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_007ac6ed;
      uVar6 = (uint)*(undefined8 *)(p->pObjs + iVar1);
      uVar7 = (p->pObjs + iVar1)[-(ulong)(uVar6 & 0x1fffffff)].Value;
      if ((int)uVar7 < 0) goto LAB_007ac74a;
      uVar7 = Gia_ManAppendBuf(p_00,uVar6 >> 0x1d & 1 ^ uVar7);
      if (((int)uVar14 < 0) || (p->vCis->nSize <= (int)uVar14)) goto LAB_007ac70c;
      iVar1 = p->vCis->pArray[uVar14];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_007ac6ed;
      p->pObjs[iVar1].Value = uVar7;
      uVar16 = uVar16 + 1;
      uVar14 = uVar14 + 1;
    } while ((int)uVar16 < nBarBufs);
  }
  else {
    uVar16 = (ulong)uVar15;
  }
  if ((int)uVar16 != nBarBufs) {
    __assert_fail("k == nBarBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x152,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  uVar15 = iVar2 - nBarBufs;
  if (0 < (int)uVar15) {
    uVar16 = (ulong)(uint)nBarBufs;
    uVar14 = (ulong)uVar15;
    do {
      if ((nBarBufs < 0) || (p->vCos->nSize <= (int)uVar16)) {
LAB_007ac70c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCos->pArray[uVar16];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_007ac6ed:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar6 = (uint)*(undefined8 *)(p->pObjs + iVar1);
      uVar7 = (p->pObjs + iVar1)[-(ulong)(uVar6 & 0x1fffffff)].Value;
      if ((int)uVar7 < 0) {
LAB_007ac74a:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar6 >> 0x1d & 1 ^ uVar7);
      uVar16 = uVar16 + 1;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  if (p_00->nBufs != nBarBufs) {
    __assert_fail("Gia_ManBufNum(pNew) == nBarBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x156,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  if (p_00->vCis->nSize != uVar5) {
    __assert_fail("Gia_ManCiNum(pNew) == nPiReal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x157,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  if (p_00->vCos->nSize != uVar15) {
    __assert_fail("Gia_ManCoNum(pNew) == nPoReal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScript.c"
                  ,0x158,"Gia_Man_t *Gia_ManDupToBarBufs(Gia_Man_t *, int)");
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupToBarBufs( Gia_Man_t * p, int nBarBufs )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int nPiReal = Gia_ManCiNum(p) - nBarBufs;
    int nPoReal = Gia_ManCoNum(p) - nBarBufs;
    int i, k = 0;
    assert( Gia_ManBufNum(p) == 0 );
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManHasChoices(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nPiReal; i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        for ( ; k < nBarBufs; k++ )
            if ( ~Gia_ObjFanin0(Gia_ManCo(p, k))->Value )
                Gia_ManCi(p, nPiReal + k)->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p, k)) );
            else
                break;
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
            pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);  
    }
    for ( ; k < nBarBufs; k++ )
        if ( ~Gia_ObjFanin0Copy(Gia_ManCo(p, k)) )
            Gia_ManCi(p, nPiReal + k)->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p, k)) );
    assert( k == nBarBufs );
    for ( i = 0; i < nPoReal; i++ )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p, nBarBufs+i)) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( Gia_ManBufNum(pNew) == nBarBufs );
    assert( Gia_ManCiNum(pNew) == nPiReal );
    assert( Gia_ManCoNum(pNew) == nPoReal );
    return pNew;
}